

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix4d> *value)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  matrix4d *pmVar4;
  storage_t<tinyusdz::value::matrix4d> *psVar5;
  byte bVar6;
  matrix4d v;
  matrix4d local_90;
  
  bVar6 = 0;
  bVar2 = MaybeNone(this);
  if (bVar2) {
    value->has_value_ = false;
    bVar2 = true;
  }
  else {
    local_90.m[0][0] = 1.0;
    local_90.m[0][1] = 0.0;
    local_90.m[0][2] = 0.0;
    local_90.m[0][3] = 0.0;
    local_90.m[1][0] = 0.0;
    local_90.m[1][1] = 1.0;
    local_90.m[1][2] = 0.0;
    local_90.m[1][3] = 0.0;
    local_90.m[2][0] = 0.0;
    local_90.m[2][1] = 0.0;
    local_90.m[2][2] = 1.0;
    local_90.m[2][3] = 0.0;
    local_90.m[3][0] = 0.0;
    local_90.m[3][1] = 0.0;
    local_90.m[3][2] = 0.0;
    local_90.m[3][3] = 1.0;
    bVar2 = ParseMatrix(this,&local_90);
    if (bVar2) {
      bVar1 = value->has_value_;
      pmVar4 = &local_90;
      psVar5 = &value->contained;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(double *)psVar5 = pmVar4->m[0][0];
        pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        psVar5 = (storage_t<tinyusdz::value::matrix4d> *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      if (bVar1 == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix4d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix4d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}